

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O0

int run_test_random_async(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop_00;
  uv_loop_t *loop;
  uv_random_t req;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_random(uVar2,&loop,scratch,0x100,0xffffffff,random_cb);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x3a,"UV_EINVAL == uv_random(loop, &req, scratch, sizeof(scratch), -1, random_cb)");
    abort();
  }
  iVar1 = uv_random(uVar2,&loop,scratch,0xffffffffffffffff,0xffffffff,random_cb);
  if (iVar1 != -7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x3b,"UV_E2BIG == uv_random(loop, &req, scratch, -1, -1, random_cb)");
    abort();
  }
  iVar1 = uv_random(uVar2,&loop,scratch,0,0,random_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x3d,"0 == uv_random(loop, &req, scratch, 0, 0, random_cb)");
    abort();
  }
  if (random_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x3e,"0 == random_cb_called");
    abort();
  }
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x40,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (random_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x41,"1 == random_cb_called");
    abort();
  }
  iVar1 = uv_random(uVar2,&loop,scratch,0x100,0,random_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x43,"0 == uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb)");
    abort();
  }
  if (random_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x44,"1 == random_cb_called");
    abort();
  }
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x46,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (random_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x47,"2 == random_cb_called");
    abort();
  }
  loop_00 = (uv_loop_t *)uv_default_loop();
  close_loop(loop_00);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x49,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(random_async) {
  uv_random_t req;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT(UV_EINVAL == uv_random(loop, &req, scratch, sizeof(scratch), -1,
                                random_cb));
  ASSERT(UV_E2BIG == uv_random(loop, &req, scratch, -1, -1, random_cb));

  ASSERT(0 == uv_random(loop, &req, scratch, 0, 0, random_cb));
  ASSERT(0 == random_cb_called);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == random_cb_called);

  ASSERT(0 == uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb));
  ASSERT(1 == random_cb_called);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(2 == random_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}